

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O0

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
DisconnectedBlockTransactions::AddTransactionsFromBlock
          (DisconnectedBlockTransactions *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *vtx)

{
  bool bVar1;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_00;
  type_conflict3 *ptVar2;
  size_t sVar3;
  value_type *in_RSI;
  unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_false,_true>,_bool>
  pVar4;
  type_conflict3 *inserted;
  type *_;
  iterator it;
  const_reverse_iterator block_it;
  unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
  *in_stack_ffffffffffffff48;
  CTransaction *this_01;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffff50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff58;
  unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
  *this_02;
  const_iterator __position;
  _Node_iterator_base<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_true>
  in_stack_ffffffffffffffb0;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __position._M_node =
       (_List_node_base *)
       &in_RSI[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  this_02 = in_RDI;
  this_00 = (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)std::
               unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
               ::size(in_stack_ffffffffffffff48);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_ffffffffffffff48);
  std::
  unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
  ::reserve(in_stack_ffffffffffffff48,0x949908);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::rbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_RDI);
  while( true ) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::rend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_RDI);
    bVar1 = std::
            operator==<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                        *)in_stack_ffffffffffffff58,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                        *)in_stack_ffffffffffffff50);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_01 = (CTransaction *)(in_RSI + 1);
    std::__cxx11::
    list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::end(in_stack_ffffffffffffff50);
    std::_List_const_iterator<std::shared_ptr<const_CTransaction>_>::_List_const_iterator
              ((_List_const_iterator<std::shared_ptr<const_CTransaction>_> *)this_01,
               (iterator *)0x949975);
    in_stack_ffffffffffffff50 = &local_20;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                 *)in_stack_ffffffffffffff50);
    std::__cxx11::
    list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::insert(this_00,__position,in_RSI);
    in_stack_ffffffffffffff58 =
         &in_RSI[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                 *)in_stack_ffffffffffffff50);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_01);
    CTransaction::GetHash(this_01);
    pVar4 = std::
            unordered_map<uint256,std::_List_iterator<std::shared_ptr<CTransaction_const>>,SaltedTxidHasher,std::equal_to<uint256>,std::allocator<std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>>>
            ::
            emplace<transaction_identifier<false>const&,std::_List_iterator<std::shared_ptr<CTransaction_const>>&>
                      (this_02,(transaction_identifier<false> *)in_RDI,
                       (_List_iterator<std::shared_ptr<const_CTransaction>_> *)
                       in_stack_ffffffffffffff58);
    in_stack_ffffffffffffffb0._M_cur =
         (__node_type *)
         pVar4.first.
         super__Node_iterator_base<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_true>
         ._M_cur;
    local_20.
    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl._M_node._M_size._0_1_ = pVar4.second;
    local_20.
    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)in_stack_ffffffffffffffb0._M_cur;
    std::
    get<0ul,std::__detail::_Node_iterator<std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>,false,true>,bool>
              ((pair<std::__detail::_Node_iterator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_false,_true>,_bool>
                *)this_01);
    ptVar2 = std::
             get<1ul,std::__detail::_Node_iterator<std::pair<uint256_const,std::_List_iterator<std::shared_ptr<CTransaction_const>>>,false,true>,bool>
                       ((pair<std::__detail::_Node_iterator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_false,_true>,_bool>
                         *)this_01);
    if ((*ptVar2 & 1U) == 0) {
      __assert_fail("inserted",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/disconnected_transactions.cpp"
                    ,0x37,
                    "std::vector<CTransactionRef> DisconnectedBlockTransactions::AddTransactionsFromBlock(const std::vector<CTransactionRef> &)"
                   );
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                 *)in_stack_ffffffffffffff50);
    sVar3 = RecursiveDynamicUsage<CTransaction_const>
                      ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffff58);
    (in_RSI->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)
         ((long)(((in_RSI->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + (sVar3 - 0x39));
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                  *)this_01);
  }
  LimitMemoryUsage((DisconnectedBlockTransactions *)in_stack_ffffffffffffffb0._M_cur);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)this_02;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] std::vector<CTransactionRef> DisconnectedBlockTransactions::AddTransactionsFromBlock(const std::vector<CTransactionRef>& vtx)
{
    iters_by_txid.reserve(iters_by_txid.size() + vtx.size());
    for (auto block_it = vtx.rbegin(); block_it != vtx.rend(); ++block_it) {
        auto it = queuedTx.insert(queuedTx.end(), *block_it);
        auto [_, inserted] = iters_by_txid.emplace((*block_it)->GetHash(), it);
        assert(inserted); // callers may never pass multiple transactions with the same txid
        cachedInnerUsage += RecursiveDynamicUsage(*block_it);
    }
    return LimitMemoryUsage();
}